

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::TranslateWindowsInViewport(ImGuiViewportP *viewport,ImVec2 *old_pos,ImVec2 *new_pos)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  uint uVar3;
  uint uVar4;
  ImGuiWindow **ppIVar5;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  float fVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  if ((viewport->Window != (ImGuiWindow *)0x0) ||
     (((viewport->super_ImGuiViewport).Flags & 0x1000) == 0)) {
    __assert_fail("viewport->Window == __null && (viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2e11,
                  "void ImGui::TranslateWindowsInViewport(ImGuiViewportP *, const ImVec2 &, const ImVec2 &)"
                 );
  }
  lVar10 = (long)(GImGui->Windows).Size;
  if (0 < lVar10) {
    uVar3 = GImGui->ConfigFlagsLastFrame;
    uVar4 = GImGui->ConfigFlagsCurrFrame;
    IVar1 = (viewport->super_ImGuiViewport).Size;
    fVar15 = (*old_pos).x;
    fVar16 = (*old_pos).y;
    fVar17 = (*new_pos).x - fVar15;
    fVar18 = (*new_pos).y - fVar16;
    ppIVar5 = (GImGui->Windows).Data;
    lVar11 = 0;
    do {
      pIVar6 = ppIVar5[lVar11];
      if (((uVar3 ^ uVar4) >> 10 & 1) == 0) {
        if (pIVar6->Viewport == viewport) {
          fVar19 = (pIVar6->Pos).x;
          fVar20 = (pIVar6->Pos).y;
          if ((fVar15 <= fVar19) && ((-(ushort)(fVar16 <= fVar20) & 1) != 0)) {
            iVar13 = -(uint)((pIVar6->Size).x + fVar19 <= IVar1.x + fVar15);
            iVar14 = -(uint)((pIVar6->Size).y + fVar20 <= IVar1.y + fVar16);
            auVar8._4_4_ = iVar13;
            auVar8._0_4_ = iVar13;
            auVar8._8_4_ = iVar14;
            auVar8._12_4_ = iVar14;
            uVar12 = movmskpd((uint)(ushort)-(ushort)(fVar16 <= fVar20),auVar8);
            if (((uVar12 & 1) != 0) && ((byte)((byte)uVar12 >> 1) != 0)) goto LAB_0013db29;
          }
        }
      }
      else {
        fVar19 = (pIVar6->Pos).x;
        fVar20 = (pIVar6->Pos).y;
LAB_0013db29:
        IVar2.y = fVar20 + fVar18;
        IVar2.x = fVar19 + fVar17;
        pIVar6->Pos = IVar2;
        fVar19 = (pIVar6->ClipRect).Min.y;
        fVar20 = (pIVar6->ClipRect).Max.x;
        fVar9 = (pIVar6->ClipRect).Max.y;
        (pIVar6->ClipRect).Min.x = (pIVar6->ClipRect).Min.x + fVar17;
        (pIVar6->ClipRect).Min.y = fVar19 + fVar18;
        (pIVar6->ClipRect).Max.x = fVar20 + fVar17;
        (pIVar6->ClipRect).Max.y = fVar9 + fVar18;
        fVar19 = (pIVar6->OuterRectClipped).Min.y;
        fVar20 = (pIVar6->OuterRectClipped).Max.x;
        fVar9 = (pIVar6->OuterRectClipped).Max.y;
        (pIVar6->OuterRectClipped).Min.x = (pIVar6->OuterRectClipped).Min.x + fVar17;
        (pIVar6->OuterRectClipped).Min.y = fVar19 + fVar18;
        (pIVar6->OuterRectClipped).Max.x = fVar20 + fVar17;
        (pIVar6->OuterRectClipped).Max.y = fVar9 + fVar18;
        fVar19 = (pIVar6->InnerRect).Min.y;
        fVar20 = (pIVar6->InnerRect).Max.x;
        fVar9 = (pIVar6->InnerRect).Max.y;
        (pIVar6->InnerRect).Min.x = (pIVar6->InnerRect).Min.x + fVar17;
        (pIVar6->InnerRect).Min.y = fVar19 + fVar18;
        (pIVar6->InnerRect).Max.x = fVar20 + fVar17;
        (pIVar6->InnerRect).Max.y = fVar9 + fVar18;
        IVar2 = (pIVar6->DC).CursorPos;
        IVar7.y = IVar2.y + fVar18;
        IVar7.x = IVar2.x + fVar17;
        (pIVar6->DC).CursorPos = IVar7;
        fVar19 = (pIVar6->DC).CursorStartPos.y;
        fVar20 = (pIVar6->DC).CursorMaxPos.x;
        fVar9 = (pIVar6->DC).CursorMaxPos.y;
        (pIVar6->DC).CursorStartPos.x = (pIVar6->DC).CursorStartPos.x + fVar17;
        (pIVar6->DC).CursorStartPos.y = fVar19 + fVar18;
        (pIVar6->DC).CursorMaxPos.x = fVar20 + fVar17;
        (pIVar6->DC).CursorMaxPos.y = fVar9 + fVar18;
      }
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  return;
}

Assistant:

void ImGui::TranslateWindowsInViewport(ImGuiViewportP* viewport, const ImVec2& old_pos, const ImVec2& new_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(viewport->Window == NULL && (viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows));

    // 1) We test if ImGuiConfigFlags_ViewportsEnable was just toggled, which allows us to conveniently
    // translate imgui windows from OS-window-local to absolute coordinates or vice-versa.
    // 2) If it's not going to fit into the new size, keep it at same absolute position.
    // One problem with this is that most Win32 applications doesn't update their render while dragging,
    // and so the window will appear to teleport when releasing the mouse.
    const bool translate_all_windows = (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable) != (g.ConfigFlagsLastFrame & ImGuiConfigFlags_ViewportsEnable);
    ImRect test_still_fit_rect(old_pos, old_pos + viewport->Size);
    ImVec2 delta_pos = new_pos - old_pos;
    for (int window_n = 0; window_n < g.Windows.Size; window_n++) // FIXME-OPT
        if (translate_all_windows || (g.Windows[window_n]->Viewport == viewport && test_still_fit_rect.Contains(g.Windows[window_n]->Rect())))
            TranslateWindow(g.Windows[window_n], delta_pos);
}